

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O1

aiColor4D __thiscall
Assimp::MDLImporter::ReplaceTextureWithColor(MDLImporter *this,aiTexture *pcTexture)

{
  uchar *puVar1;
  aiTexel *paVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  aiColor4D aVar7;
  
  if (pcTexture == (aiTexture *)0x0) {
    __assert_fail("__null != pcTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0x67,"aiColor4D Assimp::MDLImporter::ReplaceTextureWithColor(const aiTexture *)")
    ;
  }
  uVar5 = 0x7fc00000;
  uVar6 = 0;
  if ((pcTexture->mHeight != 0) && (pcTexture->mWidth != 0)) {
    paVar2 = pcTexture->pcData;
    lVar4 = 4;
    while ((ulong)(pcTexture->mWidth * pcTexture->mHeight) << 2 != lVar4) {
      if (((((&paVar2->b)[lVar4] != (&paVar2[-1].b)[lVar4]) ||
           ((&paVar2->r)[lVar4] != *(uchar *)((long)paVar2 + lVar4 + -2))) ||
          ((&paVar2->g)[lVar4] != *(uchar *)((long)paVar2 + lVar4 + -3))) ||
         (puVar1 = &paVar2->a + lVar4, lVar3 = lVar4 + -1, lVar4 = lVar4 + 4,
         *puVar1 != *(uchar *)((long)paVar2 + lVar3))) goto LAB_0044e6da;
    }
    uVar5 = CONCAT44((float)paVar2->g / 255.0,(float)paVar2->r / 255.0);
    uVar6 = CONCAT44((float)paVar2->a / 255.0,(float)paVar2->b / 255.0);
  }
LAB_0044e6da:
  aVar7.b = (float)(int)uVar6;
  aVar7.a = (float)(int)((ulong)uVar6 >> 0x20);
  aVar7.r = (float)(int)uVar5;
  aVar7.g = (float)(int)((ulong)uVar5 >> 0x20);
  return aVar7;
}

Assistant:

aiColor4D MDLImporter::ReplaceTextureWithColor(const aiTexture* pcTexture)
{
    ai_assert(NULL != pcTexture);

    aiColor4D clrOut;
    clrOut.r = get_qnan();
    if (!pcTexture->mHeight || !pcTexture->mWidth)
        return clrOut;

    const unsigned int iNumPixels = pcTexture->mHeight*pcTexture->mWidth;
    const aiTexel* pcTexel = pcTexture->pcData+1;
    const aiTexel* const pcTexelEnd = &pcTexture->pcData[iNumPixels];

    while (pcTexel != pcTexelEnd)
    {
        if (*pcTexel != *(pcTexel-1))
        {
            pcTexel = NULL;
            break;
        }
        ++pcTexel;
    }
    if (pcTexel)
    {
        clrOut.r = pcTexture->pcData->r / 255.0f;
        clrOut.g = pcTexture->pcData->g / 255.0f;
        clrOut.b = pcTexture->pcData->b / 255.0f;
        clrOut.a = pcTexture->pcData->a / 255.0f;
    }
    return clrOut;
}